

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O3

BaseTableColumnInfo __thiscall
duckdb::FindBaseTableColumn(duckdb *this,LogicalOperator *op,ColumnBinding binding)

{
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  type pLVar4;
  LogicalGet *this_00;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar5;
  vector<duckdb::ColumnIndex,_true> *this_01;
  const_reference pvVar6;
  optional_ptr<const_duckdb::ColumnDefinition,_true> oVar7;
  LogicalProjection *pLVar8;
  reference this_02;
  pointer pEVar9;
  BoundColumnRefExpression *pBVar10;
  reference this_03;
  InternalException *this_04;
  idx_t iVar11;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *this_05;
  BaseTableColumnInfo BVar12;
  undefined1 auVar13 [16];
  ColumnBinding binding_00;
  ColumnBinding binding_01;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  value_type base_column_id;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_58;
  undefined1 local_50 [16];
  char local_40 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  binding_00.table_index = binding.table_index;
  uVar3 = (ulong)(byte)this[8];
  if (uVar3 < 0x39) {
    iVar11 = 0x1740000000019c4;
    if ((0x1740000000019c4U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 1) {
        pLVar8 = LogicalOperator::Cast<duckdb::LogicalProjection>((LogicalOperator *)this);
        if ((LogicalOperator *)pLVar8->table_index == op) {
          this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&(pLVar8->super_LogicalOperator).expressions,binding_00.table_index
                                );
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_02);
          if ((pEVar9->super_BaseExpression).type == BOUND_COLUMN_REF) {
            pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_02);
            pBVar10 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                (&pEVar9->super_BaseExpression);
            this_03 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](&(pLVar8->super_LogicalOperator).children,0);
            pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     ::operator*(this_03);
            binding_01.column_index = iVar11;
            binding_01.table_index = (pBVar10->binding).column_index;
            BVar12 = FindBaseTableColumn((duckdb *)pLVar4,
                                         (LogicalOperator *)(pBVar10->binding).table_index,
                                         binding_01);
            auVar15._0_8_ = BVar12.table.ptr;
            auVar15._8_8_ = BVar12.column.ptr;
            return (BaseTableColumnInfo)auVar15;
          }
        }
      }
      else {
        if (uVar3 != 0x19) {
          auVar17._0_8_ = (TableCatalogEntry *)0x0;
          auVar17._8_8_ = (ColumnDefinition *)0x0;
          return (BaseTableColumnInfo)auVar17;
        }
        this_00 = LogicalOperator::Cast<duckdb::LogicalGet>((LogicalOperator *)this);
        if (((LogicalOperator *)this_00->table_index == op) &&
           (oVar5 = LogicalGet::GetTable(this_00), oVar5.ptr != (TableCatalogEntry *)0x0)) {
          local_58 = oVar5;
          if ((this_00->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this_00->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_01 = LogicalGet::GetColumnIds(this_00);
            pvVar6 = vector<duckdb::ColumnIndex,_true>::operator[](this_01,binding_00.table_index);
            local_50._0_8_ = pvVar6->index;
            ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
                      ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                       (local_50 + 8),
                       &(pvVar6->child_indexes).
                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
            optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_58);
            oVar7.ptr = TableCatalogEntry::GetColumn(local_58.ptr,(LogicalIndex)local_50._0_8_);
            ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                      ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                       (local_50 + 8));
            auVar16._0_8_ = oVar5.ptr;
            auVar16._8_8_ = oVar7.ptr;
            return (BaseTableColumnInfo)auVar16;
          }
          this_04 = (InternalException *)__cxa_allocate_exception(0x10);
          local_50._0_8_ = local_40;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"Projection ids should not exist here","");
          InternalException::InternalException(this_04,(string *)local_50);
          __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    else {
      this_05 = *(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  **)(this + 0x10);
      puVar1 = *(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 **)(this + 0x18);
      if (this_05 != puVar1) {
        do {
          pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   ::operator*(this_05);
          binding_00.column_index = iVar11;
          BVar12 = FindBaseTableColumn((duckdb *)pLVar4,op,binding_00);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = BVar12.column.ptr.ptr;
          if (BVar12.table.ptr.ptr != (TableCatalogEntry *)0x0) {
            auVar14._0_8_ = BVar12.table.ptr;
            auVar14._8_8_ = BVar12.column.ptr;
            return (BaseTableColumnInfo)auVar14;
          }
          this_05 = this_05 + 1;
        } while (this_05 != puVar1);
        auVar13._0_8_ = SUB168(auVar2 << 0x40,0);
        auVar13._8_8_ = SUB168(auVar2 << 0x40,8);
        return (BaseTableColumnInfo)auVar13;
      }
    }
  }
  return (BaseTableColumnInfo)ZEXT816(0);
}

Assistant:

BaseTableColumnInfo FindBaseTableColumn(LogicalOperator &op, ColumnBinding binding) {
	BaseTableColumnInfo result;
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_GET: {
		auto &get = op.Cast<LogicalGet>();
		if (get.table_index != binding.table_index) {
			return result;
		}
		auto table = get.GetTable();
		if (!table) {
			break;
		}
		if (!get.projection_ids.empty()) {
			throw InternalException("Projection ids should not exist here");
		}
		result.table = table;
		auto base_column_id = get.GetColumnIds()[binding.column_index];
		result.column = &table->GetColumn(LogicalIndex(base_column_id.GetPrimaryIndex()));
		return result;
	}
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		auto &projection = op.Cast<LogicalProjection>();
		if (binding.table_index != projection.table_index) {
			break;
		}
		auto &expr = projection.expressions[binding.column_index];
		if (expr->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
			// if the projection at this index only has a column reference we can directly trace it to the base table
			auto &bound_colref = expr->Cast<BoundColumnRefExpression>();
			return FindBaseTableColumn(*projection.children[0], bound_colref.binding);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_LIMIT:
	case LogicalOperatorType::LOGICAL_ORDER_BY:
	case LogicalOperatorType::LOGICAL_TOP_N:
	case LogicalOperatorType::LOGICAL_SAMPLE:
	case LogicalOperatorType::LOGICAL_DISTINCT:
	case LogicalOperatorType::LOGICAL_FILTER:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_JOIN:
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		// for any "pass-through" operators - search in children directly
		for (auto &child : op.children) {
			result = FindBaseTableColumn(*child, binding);
			if (result.table) {
				return result;
			}
		}
		break;
	default:
		// unsupported operator
		break;
	}
	return result;
}